

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynarray.c
# Opt level: O2

size_t sysbvm_dynarray_addAll(sysbvm_dynarray_t *dynarray,size_t entryCount,void *newEntries)

{
  size_t sVar1;
  uint8_t *__src;
  ulong uVar2;
  uint8_t *__dest;
  ulong uVar3;
  size_t sVar4;
  
  sVar4 = dynarray->size;
  uVar3 = dynarray->capacity;
  if (uVar3 < sVar4 + entryCount) {
    uVar2 = 0x10;
    if (0x10 < uVar3) {
      uVar2 = uVar3;
    }
    do {
      uVar3 = uVar2;
      uVar2 = uVar3 * 2;
    } while (uVar3 < sVar4 + entryCount);
    sVar1 = dynarray->entrySize;
    __dest = (uint8_t *)malloc(sVar1 * uVar3);
    __src = dynarray->data;
    memcpy(__dest,__src,sVar4 * sVar1);
    free(__src);
    dynarray->capacity = uVar3;
    dynarray->data = __dest;
    sVar4 = dynarray->size;
  }
  else {
    __dest = dynarray->data;
  }
  memcpy(__dest + sVar4 * dynarray->entrySize,newEntries,dynarray->entrySize * entryCount);
  sVar4 = entryCount + dynarray->size;
  dynarray->size = sVar4;
  return sVar4;
}

Assistant:

size_t sysbvm_dynarray_addAll(sysbvm_dynarray_t *dynarray, size_t entryCount, const void *newEntries)
{
    size_t requiredCapacity = dynarray->size + entryCount;
    if(requiredCapacity > dynarray->capacity)
    {
        size_t newCapacity = dynarray->capacity;
        if(newCapacity < 16)
            newCapacity = 16;

        while(newCapacity < requiredCapacity)
            newCapacity *= 2;

        uint8_t *newStorage = (uint8_t*)malloc(dynarray->entrySize * newCapacity);
        memcpy(newStorage, dynarray->data, dynarray->entrySize * dynarray->size);
        free(dynarray->data);

        dynarray->capacity = newCapacity;
        dynarray->data = newStorage;
    }

    memcpy(dynarray->data + dynarray->size*dynarray->entrySize, newEntries, entryCount*dynarray->entrySize);
    dynarray->size += entryCount;
    return dynarray->size;
}